

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

char * js_strdup(JSContext *ctx,char *str)

{
  char *pcVar1;
  JSContext *in_RSI;
  size_t in_RDI;
  JSContext *ctx_00;
  
  ctx_00 = in_RSI;
  strlen((char *)in_RSI);
  pcVar1 = js_strndup(ctx_00,(char *)in_RSI,in_RDI);
  return pcVar1;
}

Assistant:

char *js_strdup(JSContext *ctx, const char *str)
{
    return js_strndup(ctx, str, strlen(str));
}